

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O0

int gen_enum_parser(fb_output_t *out,fb_compound_type_t *ct)

{
  undefined1 local_138 [8];
  trie_t trie;
  undefined1 local_100 [4];
  int n;
  fb_scoped_name_t snt;
  fb_compound_type_t *ct_local;
  fb_output_t *out_local;
  
  trie._44_4_ = 0;
  snt._224_8_ = ct;
  memset(local_138,0,0x30);
  if ((*(short *)(snt._224_8_ + 0x10) != 3) && (*(short *)(snt._224_8_ + 0x10) != 4)) {
    __assert_fail("ct->symbol.kind == fb_is_enum || ct->symbol.kind == fb_is_union",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                  ,0x513,"int gen_enum_parser(fb_output_t *, fb_compound_type_t *)");
  }
  local_138 = (undefined1  [8])
              build_compound_dict((fb_compound_type_t *)snt._224_8_,(int *)&trie.field_0x2c);
  if ((local_138 == (undefined1  [8])0x0) && (0 < (int)trie._44_4_)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
            ,0x516,"internal error: could not build dictionary for json parser\n");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                  ,0x516,"int gen_enum_parser(fb_output_t *, fb_compound_type_t *)");
  }
  trie.gen_unmatched = (gen_unmatched_f *)snt._224_8_;
  trie.ct._0_4_ = 2;
  trie.dict = (dict_entry_t *)gen_enum_match;
  trie.gen_match = gen_enum_unmatched;
  memset(local_100,0,0xe8);
  fb_compound_name((fb_compound_type_t *)snt._224_8_,(fb_scoped_name_t *)local_100);
  println(out,
          "static const char *%s_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
          ,local_100);
  out->indent = out->indent + 1;
  out->indent = out->indent + 1;
  println(out,"int *value_sign, uint64_t *value, int *aggregate)");
  if (out->indent == 0) {
    __assert_fail("out->indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                  ,0x524,"int gen_enum_parser(fb_output_t *, fb_compound_type_t *)");
  }
  out->indent = out->indent + -1;
  if (out->indent != 0) {
    out->indent = out->indent + -1;
    println(out,"{");
    out->indent = out->indent + 1;
    if (trie._44_4_ == 0) {
      println(out,"/* Enum has no fields. */");
      println(out,"*aggregate = 0;");
      println(out,"return buf; /* unmatched; */");
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x52a,"int gen_enum_parser(fb_output_t *, fb_compound_type_t *)");
      }
      out->indent = out->indent + -1;
      println(out,"}");
    }
    else {
      println(out,"const char *unmatched = buf;");
      println(out,"const char *mark;");
      println(out,"uint64_t w;");
      println(out,"");
      println(out,"w = flatcc_json_parser_symbol_part(buf, end);");
      gen_trie(out,(trie_t *)local_138,0,trie._44_4_ + -1,0);
      println(out,"return buf;");
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x533,"int gen_enum_parser(fb_output_t *, fb_compound_type_t *)");
      }
      out->indent = out->indent + -1;
      println(out,"}");
    }
    println(out,"");
    clear_dict((dict_entry_t *)local_138);
    return 0;
  }
  __assert_fail("out->indent",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                ,0x524,"int gen_enum_parser(fb_output_t *, fb_compound_type_t *)");
}

Assistant:

static int gen_enum_parser(fb_output_t *out, fb_compound_type_t *ct)
{
    fb_scoped_name_t snt;
    int n = 0;
    trie_t trie;

    fb_clear(trie);
    assert(ct->symbol.kind == fb_is_enum || ct->symbol.kind == fb_is_union);

    if ((trie.dict = build_compound_dict(ct, &n)) == 0 && n > 0) {
        gen_panic(out, "internal error: could not build dictionary for json parser\n");
        return -1;
    }
    trie.ct = ct;
    trie.type = enum_trie;
    trie.gen_match = gen_enum_match;
    trie.gen_unmatched = gen_enum_unmatched;

    fb_clear(snt);
    fb_compound_name(ct, &snt);

    println(out, "static const char *%s_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,", snt.text);
    indent(); indent();
    println(out, "int *value_sign, uint64_t *value, int *aggregate)");
    unindent(); unindent();
    println(out, "{"); indent();
    if (n == 0) {
        println(out, "/* Enum has no fields. */");
        println(out, "*aggregate = 0;");
        println(out, "return buf; /* unmatched; */");
        unindent(); println(out, "}");
    } else {
        println(out, "const char *unmatched = buf;");
        println(out, "const char *mark;");
        println(out, "uint64_t w;");
        println(out, "");
        println(out, "w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(out, &trie, 0, n - 1, 0);
        println(out, "return buf;");
        unindent(); println(out, "}");
    }
    println(out, "");
    clear_dict(trie.dict);
    return 0;
}